

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

QPainterPath __thiscall QPainterPath::toReversed(QPainterPath *this)

{
  uint uVar1;
  Element *pEVar2;
  ElementType EVar3;
  QPainterPathPrivate *pQVar4;
  QPainterPathPrivate *pQVar5;
  Element *pEVar6;
  uint uVar7;
  QPainterPath *in_RSI;
  long in_FS_OFFSET;
  QPainterPath copy;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (in_RSI->d_ptr).d.ptr;
  (this->d_ptr).d.ptr = (QPainterPathPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QPainterPath(this);
  pQVar5 = (in_RSI->d_ptr).d.ptr;
  if ((pQVar5 == (QPainterPathPrivate *)0x0) ||
     (((pQVar5->elements).d.size == 1 && (((pQVar5->elements).d.ptr)->type == MoveToElement)))) {
    local_48.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath((QPainterPath *)&local_48,in_RSI);
    pQVar4 = (this->d_ptr).d.ptr;
    (this->d_ptr).d.ptr = (QPainterPathPrivate *)local_48.xp;
    local_48.xp = (qreal)pQVar4;
    ~QPainterPath((QPainterPath *)&local_48);
  }
  else {
    pEVar2 = (pQVar4->elements).d.ptr + (pQVar4->elements).d.size + -1;
    local_48.xp = pEVar2->x;
    local_48.yp = pEVar2->y;
    moveTo(this,&local_48);
    uVar7 = (uint)(pQVar4->elements).d.size;
    uVar1 = uVar7 - 1;
    if (0 < (int)uVar1) {
      do {
        pEVar6 = (pQVar4->elements).d.ptr;
        pEVar2 = pEVar6 + (uVar7 - 2);
        EVar3 = pEVar6[uVar1].type;
        if (EVar3 == MoveToElement) {
          local_48.xp = pEVar2->x;
          local_48.yp = pEVar2->y;
          moveTo(this,&local_48);
          uVar7 = uVar1;
        }
        else if (EVar3 == CurveToDataElement) {
          local_48.xp = pEVar2->x;
          local_48.yp = pEVar2->y;
          local_58.xp = pEVar6[(int)(uVar7 - 3)].x;
          local_58.yp = pEVar6[(int)(uVar7 - 3)].y;
          local_68.xp = pEVar6[(int)(uVar7 - 4)].x;
          local_68.yp = pEVar6[(int)(uVar7 - 4)].y;
          cubicTo(this,&local_48,&local_58,&local_68);
          uVar7 = uVar7 - 3;
        }
        else {
          uVar7 = uVar1;
          if (EVar3 == LineToElement) {
            local_48.xp = pEVar2->x;
            local_48.yp = pEVar2->y;
            lineTo(this,&local_48);
          }
        }
        uVar1 = uVar7 - 1;
      } while (0 < (int)uVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
}

Assistant:

QPainterPath QPainterPath::toReversed() const
{
    Q_D(const QPainterPath);
    QPainterPath rev;

    if (isEmpty()) {
        rev = *this;
        return rev;
    }

    rev.moveTo(d->elements.at(d->elements.size()-1).x, d->elements.at(d->elements.size()-1).y);

    for (int i=d->elements.size()-1; i>=1; --i) {
        const QPainterPath::Element &elm = d->elements.at(i);
        const QPainterPath::Element &prev = d->elements.at(i-1);
        switch (elm.type) {
        case LineToElement:
            rev.lineTo(prev.x, prev.y);
            break;
        case MoveToElement:
            rev.moveTo(prev.x, prev.y);
            break;
        case CurveToDataElement:
            {
                Q_ASSERT(i>=3);
                const QPainterPath::Element &cp1 = d->elements.at(i-2);
                const QPainterPath::Element &sp = d->elements.at(i-3);
                Q_ASSERT(prev.type == CurveToDataElement);
                Q_ASSERT(cp1.type == CurveToElement);
                rev.cubicTo(prev.x, prev.y, cp1.x, cp1.y, sp.x, sp.y);
                i -= 2;
                break;
            }
        default:
            Q_ASSERT(!"qt_reversed_path");
            break;
        }
    }
    //qt_debug_path(rev);
    return rev;
}